

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O2

StringTree *
capnp::_::structString
          (StringTree *__return_storage_ptr__,StructReader reader,RawBrandedSchema *schema)

{
  Schema local_58;
  Reader local_50;
  
  local_58.raw = schema;
  local_50.field_1.structValue.schema = Schema::asStruct(&local_58);
  local_50.field_1.structValue.reader.segment = reader.segment;
  local_50.field_1.structValue.reader.capTable = reader.capTable;
  local_50.field_1.structValue.reader.data = reader.data;
  local_50.field_1.structValue.reader.pointers = reader.pointers;
  local_50.field_1.structValue.reader.dataSize = reader.dataSize;
  local_50.field_1.structValue.reader.pointerCount = reader.pointerCount;
  local_50.field_1.listValue.reader.step._2_2_ = reader._38_2_;
  local_50.field_1._48_8_ = reader._40_8_;
  local_50.type = STRUCT;
  anon_unknown_2::stringify(__return_storage_ptr__,&local_50);
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree structString(StructReader reader, const RawBrandedSchema& schema) {
  return stringify(DynamicStruct::Reader(Schema(&schema).asStruct(), reader));
}